

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_temporary_files.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBTemporaryFilesInit(ClientContext *context,TableFunctionInitInput *input)

{
  BufferManager *pBVar1;
  pointer pDVar2;
  _Head_base<0UL,_duckdb::DuckDBTemporaryFilesData_*,_false> local_30;
  vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  local_28;
  
  make_uniq<duckdb::DuckDBTemporaryFilesData>();
  pBVar1 = BufferManager::GetBufferManager((ClientContext *)input);
  (*pBVar1->_vptr_BufferManager[0x1a])(&local_28,pBVar1);
  pDVar2 = unique_ptr<duckdb::DuckDBTemporaryFilesData,_std::default_delete<duckdb::DuckDBTemporaryFilesData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBTemporaryFilesData,_std::default_delete<duckdb::DuckDBTemporaryFilesData>,_true>
                         *)&local_30);
  ::std::vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ::_M_move_assign(&(pDVar2->entries).
                    super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
                   ,&local_28);
  ::std::vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ::~vector(&local_28);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBTemporaryFilesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBTemporaryFilesData>();

	result->entries = BufferManager::GetBufferManager(context).GetTemporaryFiles();
	return std::move(result);
}